

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:310:35)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:310:35)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v_00;
  value *pvVar1;
  long lVar2;
  string *this_00;
  wostream *pwVar3;
  double dVar4;
  double dVar5;
  wstring_view wVar6;
  wstring_view s;
  wstring_view local_1c0;
  gc_heap_ptr_untyped local_1b0 [2];
  value v;
  
  v_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (v_00 == pvVar1) {
    dVar4 = anon_unknown_37::date_helper::current_time_utc();
    make_date_object::anon_class_16_1_f1e7abc2::operator()
              ((anon_class_16_1_f1e7abc2 *)local_1b0,dVar4);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&v,local_1b0);
    value::value(__return_storage_ptr__,(object_ptr *)&v);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&v);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_1b0);
  }
  else {
    lVar2 = ((long)pvVar1 - (long)v_00) / 0x28;
    if (lVar2 == 1) {
      to_primitive(&v,v_00,undefined);
      if (v.type_ == string) {
        this_00 = value::string_value(&v);
        wVar6 = string::view(this_00);
        s._M_str = wVar6._M_str;
        s._M_len = (size_t)s._M_str;
        dVar4 = anon_unknown_37::date_helper::parse((date_helper *)wVar6._M_len,s);
        make_date_object::anon_class_16_1_f1e7abc2::operator()
                  ((anon_class_16_1_f1e7abc2 *)&local_1c0,dVar4);
        gc_heap_ptr_untyped::gc_heap_ptr_untyped(local_1b0,(gc_heap_ptr_untyped *)&local_1c0);
        value::value(__return_storage_ptr__,(object_ptr *)local_1b0);
      }
      else {
        dVar4 = to_number(&v);
        make_date_object::anon_class_16_1_f1e7abc2::operator()
                  ((anon_class_16_1_f1e7abc2 *)&local_1c0,dVar4);
        gc_heap_ptr_untyped::gc_heap_ptr_untyped(local_1b0,(gc_heap_ptr_untyped *)&local_1c0);
        value::value(__return_storage_ptr__,(object_ptr *)local_1b0);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_1b0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1c0);
      value::~value(&v);
    }
    else {
      if (lVar2 == 2) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&v);
        pwVar3 = std::operator<<((wostream *)&v,"Not implemented: ");
        std::operator<<(pwVar3,"new Date(value)");
        std::__cxx11::wstringbuf::str();
        local_1c0._M_len = local_1b0[0]._8_8_;
        local_1c0._M_str = (wchar_t *)local_1b0[0].heap_;
        throw_runtime_error(&local_1c0,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                            ,0x141);
      }
      dVar4 = anon_unknown_37::date_helper::time_from_args(args);
      dVar5 = NAN;
      if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
        dVar5 = (double)(-(ulong)(8.64e+15 < ABS(dVar4)) & 0x7ff8000000000000 |
                        ~-(ulong)(8.64e+15 < ABS(dVar4)) & (ulong)dVar4);
      }
      __return_storage_ptr__->type_ = number;
      (__return_storage_ptr__->field_1).n_ = dVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }